

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawFrameDecoration
          (QTextDocumentLayoutPrivate *this,QPainter *painter,QTextFrame *frame,QTextFrameData *fd,
          QRectF *clip,QRectF *rect)

{
  QBrush *this_00;
  int iVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  BorderStyle style;
  QTextFrame *pQVar6;
  QPaintDevice *pQVar7;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  QBrush bg;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  QTextFormat local_88;
  QRectF local_78;
  undefined1 local_58 [16];
  qreal local_48;
  qreal qStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::frameFormat((QTextFrame *)local_58);
  QTextFormat::brushProperty((QTextFormat *)local_90,(int)(QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  bVar4 = QBrush::doCompareEqualStyle((QBrush *)local_90,NoBrush);
  if (!bVar4) {
    iVar5 = (fd->border).val;
    dVar8 = (double)((fd->leftMargin).val + iVar5) * 0.015625;
    dVar9 = (double)((fd->topMargin).val + iVar5) * 0.015625;
    dVar2 = rect->xp + dVar8;
    dVar3 = rect->yp + dVar9;
    uVar10 = SUB84(dVar3,0);
    uVar11 = (undefined4)((ulong)dVar3 >> 0x20);
    local_58._8_4_ = uVar10;
    local_58._0_8_ = dVar2;
    local_58._12_4_ = uVar11;
    local_48 = ((double)((fd->rightMargin).val + iVar5) * -0.015625 - dVar8) + rect->w;
    qStack_40 = ((double)((fd->bottomMargin).val + iVar5) * -0.015625 - dVar9) + rect->h;
    local_78.w = 0.0;
    local_78.h = 0.0;
    local_78.xp = 0.0;
    local_78.yp = 0.0;
    local_88.format_type = uVar10;
    local_88.d.d.ptr =
         (totally_ordered_wrapper<QTextFormatPrivate_*>)
         (totally_ordered_wrapper<QTextFormatPrivate_*>)dVar2;
    local_88._12_4_ = uVar11;
    pQVar6 = QTextFrame::parentFrame(frame);
    if (pQVar6 == (QTextFrame *)0x0) {
      local_58 = *(undefined1 (*) [16])clip;
      local_48 = clip->w;
      qStack_40 = clip->h;
      pQVar7 = QPainter::device(painter);
      iVar5 = (*pQVar7->_vptr_QPaintDevice[4])(pQVar7,1);
      local_78.w = (qreal)iVar5;
      pQVar7 = QPainter::device(painter);
      iVar5 = (*pQVar7->_vptr_QPaintDevice[4])(pQVar7,2);
      local_78.h = (qreal)iVar5;
    }
    this_00 = (QBrush *)(local_a0 + 8);
    QBrush::QBrush(this_00,(QBrush *)local_90);
    fillBackground(painter,(QRectF *)local_58,this_00,(QPointF *)&local_88,&local_78);
    QBrush::~QBrush(this_00);
  }
  if ((fd->border).val != 0) {
    QPainter::save(painter);
    QColor::QColor((QColor *)local_58,lightGray);
    QPainter::setBrush(painter,(QColor)local_58);
    QPainter::setPen(painter,NoPen);
    dVar8 = (double)(fd->border).val * 0.015625;
    dVar2 = (double)(fd->leftMargin).val * 0.015625;
    dVar3 = (double)(fd->topMargin).val * 0.015625;
    local_58._8_8_ = rect->yp + dVar3;
    local_58._0_8_ = rect->xp + dVar2;
    local_48 = (((rect->w - (dVar8 + dVar8)) - dVar2) - (double)(fd->rightMargin).val * 0.015625) +
               dVar8;
    qStack_40 = (((rect->h - (dVar8 + dVar8)) - dVar3) - (double)(fd->bottomMargin).val * 0.015625)
                + dVar8;
    iVar5 = (fd->effectiveTopMargin).val;
    iVar1 = (fd->effectiveBottomMargin).val;
    QTextFrame::frameFormat((QTextFrame *)&local_78);
    QTextFormat::brushProperty((QTextFormat *)local_a0,(int)&local_78);
    QTextFrame::frameFormat((QTextFrame *)&local_88);
    style = QTextFormat::intProperty(&local_88,0x4010);
    drawBorder(this,painter,(QRectF *)local_58,(double)iVar5 * 0.015625,(double)iVar1 * 0.015625,
               dVar8,(QBrush *)local_a0,style);
    QTextFormat::~QTextFormat(&local_88);
    QBrush::~QBrush((QBrush *)local_a0);
    QTextFormat::~QTextFormat((QTextFormat *)&local_78);
    QPainter::restore(painter);
  }
  QBrush::~QBrush((QBrush *)local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawFrameDecoration(QPainter *painter, QTextFrame *frame, QTextFrameData *fd, const QRectF &clip, const QRectF &rect) const
{

    const QBrush bg = frame->frameFormat().background();
    if (bg != Qt::NoBrush) {
        QRectF bgRect = rect;
        bgRect.adjust((fd->leftMargin + fd->border).toReal(),
                      (fd->topMargin + fd->border).toReal(),
                      - (fd->rightMargin + fd->border).toReal(),
                      - (fd->bottomMargin + fd->border).toReal());

        QRectF gradientRect; // invalid makes it default to bgRect
        QPointF origin = bgRect.topLeft();
        if (!frame->parentFrame()) {
            bgRect = clip;
            gradientRect.setWidth(painter->device()->width());
            gradientRect.setHeight(painter->device()->height());
        }
        fillBackground(painter, bgRect, bg, origin, gradientRect);
    }
    if (fd->border != 0) {
        painter->save();
        painter->setBrush(Qt::lightGray);
        painter->setPen(Qt::NoPen);

        const qreal leftEdge = rect.left() + fd->leftMargin.toReal();
        const qreal border = fd->border.toReal();
        const qreal topMargin = fd->topMargin.toReal();
        const qreal leftMargin = fd->leftMargin.toReal();
        const qreal bottomMargin = fd->bottomMargin.toReal();
        const qreal rightMargin = fd->rightMargin.toReal();
        const qreal w = rect.width() - 2 * border - leftMargin - rightMargin;
        const qreal h = rect.height() - 2 * border - topMargin - bottomMargin;

        drawBorder(painter, QRectF(leftEdge, rect.top() + topMargin, w + border, h + border),
                   fd->effectiveTopMargin.toReal(), fd->effectiveBottomMargin.toReal(),
                   border, frame->frameFormat().borderBrush(), frame->frameFormat().borderStyle());

        painter->restore();
    }
}